

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O2

void __thiscall QMakeInternal::QMakeBuiltin::QMakeBuiltin(QMakeBuiltin *this,QMakeBuiltinInit *d)

{
  uint uVar1;
  qsizetype qVar2;
  uint uVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  storage_type *psVar10;
  int iVar11;
  long lVar12;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView local_238;
  QByteArrayView local_228;
  QByteArrayView local_218;
  QByteArrayView local_208;
  QByteArrayView local_1f8;
  QByteArrayView local_1e8;
  QArrayDataPointer<char16_t> local_1d8;
  QByteArrayView local_1c0;
  QArrayDataPointer<char16_t> local_1b0;
  QByteArrayView local_198;
  QArrayDataPointer<char16_t> local_188;
  QByteArrayView local_170;
  QArrayDataPointer<char16_t> local_160;
  QArrayDataPointer<char16_t> local_148;
  QByteArrayView local_130;
  QArrayDataPointer<char16_t> local_120;
  QByteArrayView local_108;
  QArrayDataPointer<char16_t> local_f8;
  QByteArrayView local_e0;
  QByteArrayView local_d0;
  QByteArrayView local_c0;
  QArrayDataPointer<char16_t> local_b0;
  QByteArrayView local_98;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->usage).d.d = (Data *)0x0;
  (this->usage).d.ptr = (char16_t *)0x0;
  (this->usage).d.size = 0;
  this->index = d->func;
  iVar11 = 0;
  if (0 < d->min_args) {
    iVar11 = d->min_args;
  }
  this->minArgs = iVar11;
  iVar11 = d->max_args;
  lVar12 = (long)iVar11;
  this->maxArgs = iVar11;
  uVar1 = d->min_args;
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  if (lVar12 == 1000) {
    if (uVar3 != 1) goto LAB_001e43f7;
    psVar10 = (storage_type *)
              QByteArrayView::lengthHelperCharArray("%1(%2) requires at least one argument.",0x27);
    QVar13.m_data = psVar10;
    QVar13.m_size = (qsizetype)&local_70;
    QString::fromLatin1(QVar13);
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_98,&d->name);
    QVar14.m_data = (storage_type *)local_98.m_size;
    QVar14.m_size = (qsizetype)&local_88;
    QString::fromLatin1(QVar14);
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_c0,&d->args);
    QVar15.m_data = (storage_type *)local_c0.m_size;
    QVar15.m_size = (qsizetype)&local_b0;
    QString::fromLatin1(QVar15);
    QString::arg<QString,QString>
              ((type *)&local_58,(QString *)&local_70,(QString *)&local_88,(QString *)&local_b0);
    pDVar4 = (this->usage).d.d;
    pcVar5 = (this->usage).d.ptr;
    (this->usage).d.d = local_58.d;
    (this->usage).d.ptr = local_58.ptr;
    qVar2 = (this->usage).d.size;
    (this->usage).d.size = local_58.size;
    local_58.d = pDVar4;
    local_58.ptr = pcVar5;
    local_58.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  else {
    iVar9 = iVar11 - uVar3;
    if (iVar9 < 2) {
      if (iVar9 == 1) {
        psVar10 = (storage_type *)
                  QByteArrayView::lengthHelperCharArray("%1(%2) requires %3 or %4 arguments.",0x24);
        QVar21.m_data = psVar10;
        QVar21.m_size = (qsizetype)&local_148;
        QString::fromLatin1(QVar21);
        QByteArrayView::QByteArrayView<const_char_*,_true>(&local_170,&d->name);
        QVar22.m_data = (storage_type *)local_170.m_size;
        QVar22.m_size = (qsizetype)&local_160;
        QString::fromLatin1(QVar22);
        QByteArrayView::QByteArrayView<const_char_*,_true>(&local_198,&d->args);
        QVar23.m_data = (storage_type *)local_198.m_size;
        QVar23.m_size = (qsizetype)&local_188;
        QString::fromLatin1(QVar23);
        QByteArrayView::QByteArrayView<const_char_*,_true>(&local_1c0,QMakeBuiltin::nstr + uVar3);
        QVar24.m_data = (storage_type *)local_1c0.m_size;
        QVar24.m_size = (qsizetype)&local_1b0;
        QString::fromLatin1(QVar24);
        QByteArrayView::QByteArrayView<const_char_*,_true>(&local_1e8,QMakeBuiltin::nstr + lVar12);
        QVar25.m_data = (storage_type *)local_1e8.m_size;
        QVar25.m_size = (qsizetype)&local_1d8;
        QString::fromLatin1(QVar25);
        QString::arg<QString,QString,QString,QString>
                  ((type *)&local_58,(QString *)&local_148,(QString *)&local_160,
                   (QString *)&local_188,(QString *)&local_1b0,(QString *)&local_1d8);
        bVar8 = true;
        goto LAB_001e42d8;
      }
      if (iVar11 != 1) {
        psVar10 = (storage_type *)
                  QByteArrayView::lengthHelperCharArray("%1(%2) requires %3 arguments.",0x1e);
        QVar29.m_data = psVar10;
        QVar29.m_size = (qsizetype)&local_148;
        QString::fromLatin1(QVar29);
        QByteArrayView::QByteArrayView<const_char_*,_true>(&local_1f8,&d->name);
        QVar30.m_data = (storage_type *)local_1f8.m_size;
        QVar30.m_size = (qsizetype)&local_160;
        QString::fromLatin1(QVar30);
        QByteArrayView::QByteArrayView<const_char_*,_true>(&local_208,&d->args);
        QVar31.m_data = (storage_type *)local_208.m_size;
        QVar31.m_size = (qsizetype)&local_188;
        QString::fromLatin1(QVar31);
        QByteArrayView::QByteArrayView<const_char_*,_true>(&local_218,QMakeBuiltin::nstr + lVar12);
        QVar32.m_data = (storage_type *)local_218.m_size;
        QVar32.m_size = (qsizetype)&local_1b0;
        QString::fromLatin1(QVar32);
        QString::arg<QString,QString,QString>
                  ((type *)&local_58,(QString *)&local_148,(QString *)&local_160,
                   (QString *)&local_188,(QString *)&local_1b0);
        bVar7 = true;
        bVar8 = false;
        goto LAB_001e42db;
      }
      psVar10 = (storage_type *)
                QByteArrayView::lengthHelperCharArray("%1(%2) requires one argument.",0x1e);
      QVar26.m_data = psVar10;
      QVar26.m_size = (qsizetype)&local_148;
      QString::fromLatin1(QVar26);
      QByteArrayView::QByteArrayView<const_char_*,_true>(&local_228,&d->name);
      QVar27.m_data = (storage_type *)local_228.m_size;
      QVar27.m_size = (qsizetype)&local_160;
      QString::fromLatin1(QVar27);
      QByteArrayView::QByteArrayView<const_char_*,_true>(&local_238,&d->args);
      QVar28.m_data = (storage_type *)local_238.m_size;
      QVar28.m_size = (qsizetype)&local_188;
      QString::fromLatin1(QVar28);
      QString::arg<QString,QString>
                ((type *)&local_58,(QString *)&local_148,(QString *)&local_160,(QString *)&local_188
                );
      bVar6 = true;
      bVar8 = false;
      bVar7 = false;
    }
    else {
      psVar10 = (storage_type *)
                QByteArrayView::lengthHelperCharArray("%1(%2) requires %3 to %4 arguments.",0x24);
      QVar16.m_data = psVar10;
      QVar16.m_size = (qsizetype)&local_70;
      QString::fromLatin1(QVar16);
      QByteArrayView::QByteArrayView<const_char_*,_true>(&local_d0,&d->name);
      QVar17.m_data = (storage_type *)local_d0.m_size;
      QVar17.m_size = (qsizetype)&local_88;
      QString::fromLatin1(QVar17);
      QByteArrayView::QByteArrayView<const_char_*,_true>(&local_e0,&d->args);
      QVar18.m_data = (storage_type *)local_e0.m_size;
      QVar18.m_size = (qsizetype)&local_b0;
      QString::fromLatin1(QVar18);
      QByteArrayView::QByteArrayView<const_char_*,_true>(&local_108,QMakeBuiltin::nstr + uVar3);
      QVar19.m_data = (storage_type *)local_108.m_size;
      QVar19.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar19);
      QByteArrayView::QByteArrayView<const_char_*,_true>(&local_130,QMakeBuiltin::nstr + lVar12);
      QVar20.m_data = (storage_type *)local_130.m_size;
      QVar20.m_size = (qsizetype)&local_120;
      QString::fromLatin1(QVar20);
      QString::arg<QString,QString,QString,QString>
                ((type *)&local_58,(QString *)&local_70,(QString *)&local_88,(QString *)&local_b0,
                 (QString *)&local_f8,(QString *)&local_120);
      bVar8 = false;
LAB_001e42d8:
      bVar7 = false;
LAB_001e42db:
      bVar6 = false;
    }
    pDVar4 = (this->usage).d.d;
    pcVar5 = (this->usage).d.ptr;
    (this->usage).d.d = local_58.d;
    (this->usage).d.ptr = local_58.ptr;
    qVar2 = (this->usage).d.size;
    (this->usage).d.size = local_58.size;
    local_58.d = pDVar4;
    local_58.ptr = pcVar5;
    local_58.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (bVar6) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_160);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    }
    if (bVar7) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_160);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    }
    if (bVar8) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_160);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    }
    if (iVar9 < 2) goto LAB_001e43f7;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
LAB_001e43f7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMakeBuiltin::QMakeBuiltin(const QMakeBuiltinInit &d)
    : index(d.func), minArgs(qMax(0, d.min_args)), maxArgs(d.max_args)
{
    static const char * const nstr[6] = { "no", "one", "two", "three", "four", "five" };
    // For legacy reasons, there is actually no such thing as "no arguments"
    // - there is only "empty first argument", which needs to be mapped back.
    // -1 means "one, which may be empty", which is effectively zero, except
    // for the error message if there are too many arguments.
    int dmin = qAbs(d.min_args);
    int dmax = d.max_args;
    if (dmax == QMakeBuiltinInit::VarArgs) {
        Q_ASSERT_X(dmin < 2, "init", d.name);
        if (dmin == 1) {
            Q_ASSERT_X(d.args != nullptr, "init", d.name);
            usage = fL1S("%1(%2) requires at least one argument.")
                    .arg(fL1S(d.name), fL1S(d.args));
        }
        return;
    }
    int arange = dmax - dmin;
    Q_ASSERT_X(arange >= 0, "init", d.name);
    Q_ASSERT_X(d.args != nullptr, "init", d.name);
    usage = arange > 1
               ? fL1S("%1(%2) requires %3 to %4 arguments.")
                 .arg(fL1S(d.name), fL1S(d.args), fL1S(nstr[dmin]), fL1S(nstr[dmax]))
               : arange > 0
                   ? fL1S("%1(%2) requires %3 or %4 arguments.")
                     .arg(fL1S(d.name), fL1S(d.args), fL1S(nstr[dmin]), fL1S(nstr[dmax]))
                   : dmax != 1
                       ? fL1S("%1(%2) requires %3 arguments.")
                         .arg(fL1S(d.name), fL1S(d.args), fL1S(nstr[dmax]))
                       : fL1S("%1(%2) requires one argument.")
                         .arg(fL1S(d.name), fL1S(d.args));
}